

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::
DoSimdNarrow<wabt::interp::Simd<unsigned_char,(unsigned_char)16>,wabt::interp::Simd<short,(unsigned_char)8>>
          (Thread *this)

{
  Simd<unsigned_char,_(unsigned_char)__x10_> value;
  uchar uVar1;
  Simd<short,_(unsigned_char)__b_> SVar2;
  byte local_42;
  byte local_41;
  undefined1 uStack_40;
  undefined1 uStack_3f;
  undefined1 uStack_3e;
  undefined1 uStack_3d;
  undefined1 uStack_3c;
  undefined1 uStack_3b;
  u8 i_1;
  u8 i;
  Simd<unsigned_char,_(unsigned_char)__x10_> result;
  Simd<short,_(unsigned_char)__b_> lhs;
  Simd<short,_(unsigned_char)__b_> rhs;
  Thread *this_local;
  
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<short,(unsigned_char)8>>(this);
  SVar2 = Pop<wabt::interp::Simd<short,(unsigned_char)8>>(this);
  result.v[8] = (char)SVar2.v[0];
  result.v[9] = (char)((ushort)SVar2.v[0] >> 8);
  result.v[10] = (char)SVar2.v[1];
  result.v[0xb] = (char)((ushort)SVar2.v[1] >> 8);
  result.v[0xc] = (char)SVar2.v[2];
  result.v[0xd] = (char)((ushort)SVar2.v[2] >> 8);
  result.v[0xe] = (char)SVar2.v[3];
  result.v[0xf] = (char)((ushort)SVar2.v[3] >> 8);
  lhs.v[0] = SVar2.v[4];
  lhs.v[1] = SVar2.v[5];
  lhs.v[2] = SVar2.v[6];
  lhs.v[3] = SVar2.v[7];
  for (local_41 = 0; local_41 < 8; local_41 = local_41 + 1) {
    uVar1 = Saturate<unsigned_char,short>(lhs.v[(ulong)local_41 - 4]);
    *(uchar *)((long)lhs.v + ((ulong)local_41 - 0x18)) = uVar1;
  }
  for (local_42 = 0; local_42 < 8; local_42 = local_42 + 1) {
    uVar1 = Saturate<unsigned_char,short>(lhs.v[(ulong)local_42 + 4]);
    *(uchar *)((long)lhs.v + (long)(int)(local_42 + 8) + -0x18) = uVar1;
  }
  value.v[8] = result.v[0];
  value.v[9] = result.v[1];
  value.v[10] = result.v[2];
  value.v[0xb] = result.v[3];
  value.v[0xc] = result.v[4];
  value.v[0xd] = result.v[5];
  value.v[0xe] = result.v[6];
  value.v[0xf] = result.v[7];
  value.v[0] = uStack_40;
  value.v[1] = uStack_3f;
  value.v[2] = uStack_3e;
  value.v[3] = uStack_3d;
  value.v[4] = uStack_3c;
  value.v[5] = uStack_3b;
  value.v[6] = i_1;
  value.v[7] = i;
  Push<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdNarrow() {
  using SL = typename S::LaneType;
  using TL = typename T::LaneType;
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  for (u8 i = 0; i < T::lanes; ++i) {
    result.v[i] = Saturate<SL, TL>(lhs.v[i]);
  }
  for (u8 i = 0; i < T::lanes; ++i) {
    result.v[T::lanes + i] = Saturate<SL, TL>(rhs.v[i]);
  }
  Push(result);
  return RunResult::Ok;
}